

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O2

ec_key_st * EVP_PKEY_get1_EC_KEY(EVP_PKEY *pkey)

{
  EC_KEY *key;
  
  key = EVP_PKEY_get0_EC_KEY((EVP_PKEY *)pkey);
  if (key != (EC_KEY *)0x0) {
    EC_KEY_up_ref((EC_KEY *)key);
  }
  return (ec_key_st *)key;
}

Assistant:

EC_KEY *EVP_PKEY_get1_EC_KEY(const EVP_PKEY *pkey) {
  EC_KEY *ec_key = EVP_PKEY_get0_EC_KEY(pkey);
  if (ec_key != NULL) {
    EC_KEY_up_ref(ec_key);
  }
  return ec_key;
}